

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

void N_VDestroyVectorArray(N_Vector *vs,int count)

{
  ulong uVar1;
  ulong uVar2;
  
  if (vs != (N_Vector *)0x0) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)count;
    if (count < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      N_VDestroy(vs[uVar2]);
      vs[uVar2] = (N_Vector)0x0;
    }
    free(vs);
    return;
  }
  return;
}

Assistant:

void N_VDestroyVectorArray(N_Vector* vs, int count)
{
  int j;

  if (vs == NULL) return;

  for (j = 0; j < count; j++) {
    N_VDestroy(vs[j]);
    vs[j] = NULL;
  }

  free(vs); vs = NULL;

  return;
}